

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idct.c
# Opt level: O0

void init_txfm_param(MACROBLOCKD *xd,int plane,TX_SIZE tx_size,TX_TYPE tx_type,int eob,
                    int reduced_tx_set,TxfmParam *txfm_param)

{
  TxSetType TVar1;
  int iVar2;
  undefined1 in_CL;
  undefined1 in_DL;
  MACROBLOCKD *in_RDI;
  undefined4 in_R8D;
  int in_R9D;
  undefined1 *in_stack_00000008;
  undefined7 in_stack_ffffffffffffffe0;
  TX_SIZE tx_size_00;
  
  *in_stack_00000008 = in_CL;
  in_stack_00000008[1] = in_DL;
  *(undefined4 *)(in_stack_00000008 + 0x14) = in_R8D;
  *(int *)(in_stack_00000008 + 4) =
       in_RDI->lossless[(byte)*(undefined2 *)&(*in_RDI->mi)->field_0xa7 & 7];
  *(int *)(in_stack_00000008 + 8) = in_RDI->bd;
  iVar2 = is_cur_buf_hbd(in_RDI);
  *(int *)(in_stack_00000008 + 0xc) = iVar2;
  tx_size_00 = in_stack_00000008[1];
  iVar2 = is_inter_block((MB_MODE_INFO *)CONCAT17(tx_size_00,in_stack_ffffffffffffffe0));
  TVar1 = av1_get_ext_tx_set_type(tx_size_00,iVar2,in_R9D);
  in_stack_00000008[0x10] = TVar1;
  return;
}

Assistant:

static void init_txfm_param(const MACROBLOCKD *xd, int plane, TX_SIZE tx_size,
                            TX_TYPE tx_type, int eob, int reduced_tx_set,
                            TxfmParam *txfm_param) {
  (void)plane;
  txfm_param->tx_type = tx_type;
  txfm_param->tx_size = tx_size;
  txfm_param->eob = eob;
  txfm_param->lossless = xd->lossless[xd->mi[0]->segment_id];
  txfm_param->bd = xd->bd;
  txfm_param->is_hbd = is_cur_buf_hbd(xd);
  txfm_param->tx_set_type = av1_get_ext_tx_set_type(
      txfm_param->tx_size, is_inter_block(xd->mi[0]), reduced_tx_set);
}